

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2dae49::PpuTest_visible_scanline_output_background_left_disabled_Test::TestBody
          (PpuTest_visible_scanline_output_background_left_disabled_Test *this)

{
  code *pcVar1;
  bool bVar2;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar3;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar4;
  pointer pIVar5;
  char *pcVar6;
  Pixel *pPVar7;
  char *in_R9;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  undefined1 local_1c8 [5];
  Color expected_color;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_;
  int iStack_174;
  optional<n_e_s::core::Pixel> pixel;
  int i;
  Action<unsigned_char_(unsigned_short)> local_160;
  WithoutMatchers local_139;
  Matcher<unsigned_short> local_138;
  MockSpec<unsigned_char_(unsigned_short)> local_120;
  ReturnAction<int> local_100;
  Action<unsigned_char_(unsigned_short)> local_f0;
  WithoutMatchers local_c9;
  Matcher<unsigned_short> local_c8;
  MockSpec<unsigned_char_(unsigned_short)> local_b0;
  ReturnAction<int> local_90;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  PpuMask local_11;
  PpuTest_visible_scanline_output_background_left_disabled_Test *local_10;
  PpuTest_visible_scanline_output_background_left_disabled_Test *this_local;
  
  local_10 = this;
  n_e_s::core::PpuMask::Register(&local_11,'\b');
  (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_ =
       (uchar)local_11.super_Register<unsigned_char>.value_;
  (this->super_PpuTest).registers.mask.super_Register<unsigned_char>.value_ =
       (this->super_PpuTest).expected.mask.super_Register<unsigned_char>.value_;
  (this->super_PpuTest).registers.cycle = 1;
  (this->super_PpuTest).registers.pattern_table_shifter_hi = 0xffff;
  (this->super_PpuTest).registers.pattern_table_shifter_low = 0;
  (this->super_PpuTest).registers.pattern_table_latch_hi = 0xff;
  (this->super_PpuTest).registers.attribute_table_shifter_hi = 0xffff;
  (this->super_PpuTest).registers.attribute_table_shifter_low = 0xffff;
  (this->super_PpuTest).registers.attribute_table_latch = 0xff;
  testing::Matcher<unsigned_short>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_50,(AnythingMatcher *)&testing::_);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_38,&(this->super_PpuTest).mmu.super_MockMmu,&local_50);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_38,local_5d,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26b,"mmu","read_byte(testing::_)");
  testing::Return<int>((testing *)&local_90,0xff);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_80,(ReturnAction *)&local_90);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar4,&local_80);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_90);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
  testing::Matcher<unsigned_short>::~Matcher(&local_50);
  testing::Matcher<unsigned_short>::Matcher(&local_c8,0x3f00);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_b0,&(this->super_PpuTest).mmu.super_MockMmu,&local_c8);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_b0,&local_c9,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26c,"mmu","read_byte(0x3F00)");
  testing::Return<int>((testing *)&local_100,5);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar4,&local_f0);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f0);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_100);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b0);
  testing::Matcher<unsigned_short>::~Matcher(&local_c8);
  testing::Matcher<unsigned_short>::Matcher(&local_138,0x3f0e);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_120,&(this->super_PpuTest).mmu.super_MockMmu,&local_138);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_120,&local_139,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                      ,0x26e,"mmu","read_byte(0x3F00 + 3u * 4u + 2u)");
  testing::Return<int>
            ((testing *)
             &(((optional<n_e_s::core::Pixel> *)((long)register0x00000020 + -0x172))->
              super__Optional_base<n_e_s::core::Pixel,_true,_true>)._M_payload.
              super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._M_value.color,6);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_160,
             (ReturnAction *)
             &(((optional<n_e_s::core::Pixel> *)((long)register0x00000020 + -0x172))->
              super__Optional_base<n_e_s::core::Pixel,_true,_true>)._M_payload.
              super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._M_value.color);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillRepeatedly
            (pTVar4,&local_160);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_160);
  testing::internal::ReturnAction<int>::~ReturnAction
            ((ReturnAction<int> *)
             &(((optional<n_e_s::core::Pixel> *)((long)register0x00000020 + -0x172))->
              super__Optional_base<n_e_s::core::Pixel,_true,_true>)._M_payload.
              super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._M_value.color);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_120);
  testing::Matcher<unsigned_short>::~Matcher(&local_138);
  iStack_174 = 0;
  do {
    if (9 < iStack_174) {
      return;
    }
    pIVar5 = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::operator->
                       (&(this->super_PpuTest).ppu);
    register0x00000000 = (*pIVar5->_vptr_IPpu[4])();
    local_191 = std::optional<n_e_s::core::Pixel>::has_value
                          ((optional<n_e_s::core::Pixel> *)
                           ((long)&gtest_ar_.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl + 6));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_190,&local_191,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar2) {
      testing::Message::Message(&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c8,(internal *)local_190,(AssertionResult *)"pixel.has_value()",
                 "false","true",in_R9);
      pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8)
      ;
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x273,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      std::__cxx11::string::~string((string *)local_1c8);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    if (iStack_174 < 8) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_1_ = 0x5c;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._6_1_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._7_1_ = 0x30;
    }
    else {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_1_ = 0x54;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._6_1_ = 4;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._7_1_ = 0;
    }
    pPVar7 = std::optional<n_e_s::core::Pixel>::operator->
                       ((optional<n_e_s::core::Pixel> *)
                        ((long)&gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 6));
    testing::internal::EqHelper::Compare<n_e_s::core::Color,_n_e_s::core::Color,_nullptr>
              ((EqHelper *)local_1e0,"expected_color","pixel->color",
               (Color *)((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 5),&pPVar7->color);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
    if (!bVar2) {
      testing::Message::Message(&local_1e8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0x277,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message(&local_1e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    bVar2 = SCARRY4(iStack_174,1);
    iStack_174 = iStack_174 + 1;
  } while (!bVar2);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_F(PpuTest, visible_scanline_output_background_left_disabled) {
    // Render background, but not first 8 pixels.
    registers.mask = expected.mask = PpuMask(0b0000'1000);
    registers.cycle = 1;
    registers.pattern_table_shifter_hi = 0b1111'1111'1111'1111;
    registers.pattern_table_shifter_low = 0b0000'0000'0000'0000u;
    registers.pattern_table_latch_hi = 0xFF;
    registers.attribute_table_shifter_hi = 0xFFFF;
    registers.attribute_table_shifter_low = 0xFFFF;
    registers.attribute_table_latch = 0xFF;

    EXPECT_CALL(mmu, read_byte(testing::_)).WillRepeatedly(Return(0xFF));
    EXPECT_CALL(mmu, read_byte(0x3F00)).WillRepeatedly(Return(0x05));
    // Third palette (from attribute)
    EXPECT_CALL(mmu, read_byte(0x3F00 + 3u * 4u + 2u))
            .WillRepeatedly(Return(0x06));

    for (int i = 0; i < 10; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_TRUE(pixel.has_value());
        // Return 5th color first 8 pixels (background from 0x3F00)
        // and 6th color the following pixels.
        const auto expected_color = i < 8 ? Color{92, 0, 48} : Color{84, 4, 0};
        EXPECT_EQ(expected_color, pixel->color);
    }
}